

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::SetDomain(ON_PolyCurve *this,double t0,double t1)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ON_Interval d0;
  ON_Interval d1;
  
  dVar6 = t1;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  d0.m_t[1] = dVar6;
  ON_Interval::ON_Interval(&d1,t0,t1);
  bVar2 = ON_Interval::IsIncreasing(&d1);
  if (bVar2) {
    bVar3 = ON_Interval::operator!=(&d0,&d1);
    if (bVar3) {
      uVar1 = (this->m_t).m_count;
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        dVar6 = ON_Interval::NormalizedParameterAt(&d0,(this->m_t).m_a[uVar5]);
        dVar6 = ON_Interval::ParameterAt(&d1,dVar6);
        (this->m_t).m_a[uVar5] = dVar6;
      }
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
    }
  }
  return bVar2;
}

Assistant:

bool ON_PolyCurve::SetDomain( double t0, double t1 )
{
  ON_Interval d0 = Domain();
  ON_Interval d1(t0,t1);
  bool rc = d1.IsIncreasing();
  if ( rc && d0 != d1 )
  {
    int i, count = m_t.Count();
    double s;
    for ( i = 0; i < count; i++ )
    {
      s = d0.NormalizedParameterAt( m_t[i] );
      m_t[i] = d1.ParameterAt( s );
    }
  	DestroyRuntimeCache();
  }
  return rc;
}